

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O2

local_m_extrapolation_t * __thiscall
tchecker::zg::details::local_m_extrapolation_t::operator=
          (local_m_extrapolation_t *this,local_m_extrapolation_t *e)

{
  if (this != e) {
    this->_m = e->_m;
    e->_m = (map_t *)0x0;
    std::__shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&(this->_clock_bounds).
               super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
              ,&(e->_clock_bounds).
                super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
             );
  }
  return this;
}

Assistant:

tchecker::zg::details::local_m_extrapolation_t &
local_m_extrapolation_t::operator=(tchecker::zg::details::local_m_extrapolation_t && e)
{
  if (this != &e) {
    _m = std::move(e._m);
    e._m = nullptr;
    _clock_bounds = std::move(e._clock_bounds);
  }
  return *this;
}